

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consolelog.hpp
# Opt level: O0

void __thiscall github111116::ConsoleLogger::log<char[61]>(ConsoleLogger *this,char (*args) [61])

{
  ConsoleLogger *in_RSI;
  char (*in_RDI) [61];
  
  if (*(int *)(in_RDI[1] + 0x2f) < 1) {
    std::mutex::lock((mutex *)in_RSI);
    std::operator<<(*(ostream **)*in_RDI,"    ");
    print<char[61]>(in_RSI,in_RDI);
    std::mutex::unlock((mutex *)0x10e1f0);
  }
  return;
}

Assistant:

void ConsoleLogger::log(const Args&... args)
{
	if (loglevel > 0) return;
	mtx.lock();
	out << "    ";
	print(args...);
	mtx.unlock();
}